

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O3

void __thiscall
TCLAP::CmdLine::parse
          (CmdLine *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  size_type sVar1;
  char *pcVar2;
  CmdLine *pCVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  CmdLineParseException *pCVar7;
  pointer pbVar8;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *plVar9;
  int iVar10;
  size_type sVar11;
  _List_node_base *p_Var12;
  string local_78;
  CmdLine *local_58;
  string local_50;
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    pCVar7 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,
               "The args vector must not be empty, the first entry should contain the program\'s name."
               ,"");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"undefined","");
    CmdLineParseException::CmdLineParseException(pCVar7,&local_78,&local_50);
    __cxa_throw(pCVar7,&CmdLineParseException::typeinfo,ArgException::~ArgException);
  }
  std::__cxx11::string::_M_assign((string *)&this->_progName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(args,(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start);
  local_50._M_dataplus._M_p = (pointer)((ulong)local_50._M_dataplus._M_p._4_4_ << 0x20);
  local_58 = this;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    iVar10 = 0;
  }
  else {
    plVar9 = &this->_argList;
    iVar10 = 0;
    p_Var12 = (_List_node_base *)plVar9;
LAB_001113c7:
    do {
      p_Var12 = (((_List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)&p_Var12->_M_next)->
                _M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var12 == (_List_node_base *)plVar9) {
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        sVar1 = pbVar8[(int)(uint)local_50._M_dataplus._M_p]._M_string_length;
        if (sVar1 != 0) {
          pcVar2 = pbVar8[(int)(uint)local_50._M_dataplus._M_p]._M_dataplus._M_p;
          if (*pcVar2 == '-') {
            if (sVar1 != 1) {
              sVar11 = 1;
              do {
                if (pcVar2[sVar11] != '\a') goto LAB_0011143a;
                sVar11 = sVar11 + 1;
              } while (sVar1 != sVar11);
            }
          }
          else {
LAB_0011143a:
            if ((Arg::ignoreRestRef()::ign == '\0') && (local_58->_ignoreUnmatched == false)) {
              pCVar7 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
              local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_78,"Couldn\'t find match for argument","");
              CmdLineParseException::CmdLineParseException
                        (pCVar7,&local_78,
                         (args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start +
                         (int)(uint)local_50._M_dataplus._M_p);
              __cxa_throw(pCVar7,&CmdLineParseException::typeinfo,ArgException::~ArgException);
            }
          }
        }
      }
      else {
        cVar4 = (**(code **)(*(long *)p_Var12[1]._M_next + 0x18))(p_Var12[1]._M_next,&local_50,args)
        ;
        if (cVar4 == '\0') goto LAB_001113c7;
        iVar5 = XorHandler::check(&this->_xorHandler,(Arg *)p_Var12[1]._M_next);
        iVar10 = iVar10 + iVar5;
        pbVar8 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
      uVar6 = (uint)local_50._M_dataplus._M_p + 1;
      local_50._M_dataplus._M_p._0_4_ = uVar6;
      p_Var12 = (_List_node_base *)plVar9;
    } while ((ulong)uVar6 <
             (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5));
  }
  pCVar3 = local_58;
  iVar5 = local_58->_numRequired;
  if (iVar10 < iVar5) {
    missingArgsException(local_58);
    iVar5 = pCVar3->_numRequired;
  }
  if (iVar5 < iVar10) {
    pCVar7 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Too many arguments!","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"undefined","");
    CmdLineParseException::CmdLineParseException(pCVar7,&local_78,&local_50);
    __cxa_throw(pCVar7,&CmdLineParseException::typeinfo,ArgException::~ArgException);
  }
  return;
}

Assistant:

inline void CmdLine::parse(std::vector<std::string>& args)
{
	bool shouldExit = false;
	int estat = 0;
	try {
        if (args.empty()) {
            // https://sourceforge.net/p/tclap/bugs/30/
            throw CmdLineParseException("The args vector must not be empty, "
                                        "the first entry should contain the "
                                        "program's name.");
        }

		_progName = args.front();
		args.erase(args.begin());

		int requiredCount = 0;

		for (int i = 0; static_cast<unsigned int>(i) < args.size(); i++) 
		{
			bool matched = false;
			for (ArgListIterator it = _argList.begin();
			     it != _argList.end(); it++) {
				if ( (*it)->processArg( &i, args ) )
				{
					requiredCount += _xorHandler.check( *it );
					matched = true;
					break;
				}
			}

			// checks to see if the argument is an empty combined
			// switch and if so, then we've actually matched it
			if ( !matched && _emptyCombined( args[i] ) )
				matched = true;

			if ( !matched && !Arg::ignoreRest() && !_ignoreUnmatched)
				throw(CmdLineParseException("Couldn't find match "
				                            "for argument",
				                            args[i]));
		}

		if ( requiredCount < _numRequired )
			missingArgsException();

		if ( requiredCount > _numRequired )
			throw(CmdLineParseException("Too many arguments!"));

	} catch ( ArgException& e ) {
		// If we're not handling the exceptions, rethrow.
		if ( !_handleExceptions) {
			throw;
		}

		try {
			_output->failure(*this,e);
		} catch ( ExitException &ee ) {
			estat = ee.getExitStatus();
			shouldExit = true;
		}
	} catch (ExitException &ee) {
		// If we're not handling the exceptions, rethrow.
		if ( !_handleExceptions) {
			throw;
		}

		estat = ee.getExitStatus();
		shouldExit = true;
	}

	if (shouldExit)
		exit(estat);
}